

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmTarget *this;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,tgt,&local_41);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (this == (cmTarget *)0x0) {
    cmSystemTools::Error
              ("Attempt to add link directories to non-existent target: ",tgt," for directory ",d);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,d,&local_41);
    cmTarget::AddLinkDirectory(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                       const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: ", tgt,
      " for directory ", d);
    return;
  }
  t->AddLinkDirectory(d);
}